

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtable.c
# Opt level: O2

void checkARCAccessorsSlow(Class cls)

{
  byte *pbVar1;
  SEL expected;
  bool bVar2;
  bool bVar3;
  BOOL BVar4;
  objc_method *poVar5;
  int i;
  int i_00;
  objc_method_list *l;
  bool bVar6;
  
  if ((dtable_t)cls->dtable != uninstalled_dtable) {
    return;
  }
  if (checkARCAccessorsSlow::retain == (SEL)0x0) {
    checkARCAccessorsSlow::retain = sel_registerName("retain");
    checkARCAccessorsSlow::release = sel_registerName("release");
    checkARCAccessorsSlow::autorelease = sel_registerName("autorelease");
    checkARCAccessorsSlow::isARC = sel_registerName("_ARCCompliantRetainRelease");
  }
  if (cls->super_class == (Class)0x0) {
    bVar6 = false;
  }
  else {
    checkARCAccessorsSlow(cls->super_class);
    bVar6 = (cls->super_class->info & 0x800) == 0;
  }
  l = (objc_method_list *)&cls->methods;
  bVar2 = false;
  while (l = l->next, l != (objc_method_list *)0x0) {
    for (i_00 = 0; i_00 < l->count; i_00 = i_00 + 1) {
      poVar5 = method_at_index(l,i_00);
      expected = poVar5->selector;
      BVar4 = selEqualUnTyped(expected,checkARCAccessorsSlow::retain);
      bVar3 = true;
      if (BVar4 == '\0') {
        BVar4 = selEqualUnTyped(expected,checkARCAccessorsSlow::release);
        if (BVar4 == '\0') {
          BVar4 = selEqualUnTyped(expected,checkARCAccessorsSlow::autorelease);
          if (BVar4 == '\0') {
            BVar4 = selEqualUnTyped(expected,checkARCAccessorsSlow::isARC);
            bVar3 = bVar2;
            if (BVar4 != '\0') goto LAB_00110b79;
          }
        }
      }
      bVar2 = bVar3;
    }
  }
  if (!bVar6 && !bVar2) {
LAB_00110b79:
    pbVar1 = (byte *)((long)&cls->info + 1);
    *pbVar1 = *pbVar1 | 8;
  }
  return;
}

Assistant:

PRIVATE void checkARCAccessorsSlow(Class cls)
{
	if (cls->dtable != uninstalled_dtable)
	{
		return;
	}
	static SEL retain, release, autorelease, isARC;
	if (NULL == retain)
	{
		retain = sel_registerName("retain");
		release = sel_registerName("release");
		autorelease = sel_registerName("autorelease");
		isARC = sel_registerName("_ARCCompliantRetainRelease");
	}
	BOOL superIsFast = YES;
	if (cls->super_class != Nil)
	{
		checkARCAccessorsSlow(cls->super_class);
		superIsFast = objc_test_class_flag(cls->super_class, objc_class_flag_fast_arc);
	}
	BOOL selfImplementsRetainRelease = NO;
	for (struct objc_method_list *l=cls->methods ; l != NULL ; l= l->next)
	{
		for (int i=0 ; i<l->count ; i++)
		{
			SEL s = method_at_index(l, i)->selector;
			if (selEqualUnTyped(s, retain) ||
			    selEqualUnTyped(s, release) ||
			    selEqualUnTyped(s, autorelease))
			{
				selfImplementsRetainRelease = YES;
			}
			else if (selEqualUnTyped(s, isARC))
			{
				objc_set_class_flag(cls, objc_class_flag_fast_arc);
				return;
			}
		}
	}
	if (superIsFast && !selfImplementsRetainRelease)
	{
		objc_set_class_flag(cls, objc_class_flag_fast_arc);
	}
}